

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::SerializeWithCachedSizes
          (BayesianProbitRegressor_FeatureWeight *this,CodedOutputStream *output)

{
  uint32 uVar1;
  uint uVar2;
  BayesianProbitRegressor_FeatureValueWeight *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BayesianProbitRegressor_FeatureWeight *this_local;
  
  uVar1 = featureid(this);
  if (uVar1 != 0) {
    uVar1 = featureid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar1,output);
  }
  local_20 = 0;
  uVar2 = weights_size(this);
  for (; local_20 < uVar2; local_20 = local_20 + 1) {
    value = weights(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 featureId = 1;
  if (this->featureid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->featureid(), output);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
  for (unsigned int i = 0, n = this->weights_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->weights(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
}